

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs)

{
  bool bVar1;
  SizeType SVar2;
  SizeType SVar3;
  int iVar4;
  Ch *__s1;
  Ch *__s2;
  Ch *str2;
  Ch *str1;
  SizeType len2;
  SizeType len1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsString
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
  if (!bVar1) {
    __assert_fail("IsString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x9a4,
                  "bool rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::StringEqual(const GenericValue<Encoding, SourceAllocator> &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsString(rhs);
  if (!bVar1) {
    __assert_fail("rhs.IsString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x9a5,
                  "bool rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::StringEqual(const GenericValue<Encoding, SourceAllocator> &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
  SVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(rhs);
  if (SVar2 == SVar3) {
    __s1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
    __s2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(rhs);
    if (__s1 == __s2) {
      this_local._7_1_ = true;
    }
    else {
      iVar4 = memcmp(__s1,__s2,(ulong)SVar2);
      this_local._7_1_ = iVar4 == 0;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StringEqual(const GenericValue<Encoding, SourceAllocator>& rhs) const {
        RAPIDJSON_ASSERT(IsString());
        RAPIDJSON_ASSERT(rhs.IsString());

        const SizeType len1 = GetStringLength();
        const SizeType len2 = rhs.GetStringLength();
        if(len1 != len2) { return false; }

        const Ch* const str1 = GetString();
        const Ch* const str2 = rhs.GetString();
        if(str1 == str2) { return true; } // fast path for constant string

        return (std::memcmp(str1, str2, sizeof(Ch) * len1) == 0);
    }